

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMarker.cpp
# Opt level: O3

void __thiscall chrono::ChMarker::ArchiveIN(ChMarker *this)

{
  ChArchiveIn *in_RSI;
  
  ArchiveIN((ChMarker *)&this[-1].abs_frame.coord_dtdt,in_RSI);
  return;
}

Assistant:

void ChMarker::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChMarker>();

    // deserialize parent class
    ChObj::ArchiveIN(marchive);
    // deserialize parent class
    ChFrameMoving<double>::ArchiveIN(marchive);

    // stream in all member data:
    eChMarkerMotion_mapper mmapper;
    marchive >> CHNVP(mmapper(motion_type), "motion_type");
    marchive >> CHNVP(motion_X);
    marchive >> CHNVP(motion_Y);
    marchive >> CHNVP(motion_Z);
    marchive >> CHNVP(motion_ang);
    marchive >> CHNVP(motion_axis);
}